

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O3

string * __thiscall
testing::internal::
FormatForComparisonFailureMessage<TApp_NewEnumTest_Test::TestBody()::Level2,TApp_NewEnumTest_Test::TestBody()::Level2>
          (string *__return_storage_ptr__,internal *this,Level2 *value,Level2 *param_2)

{
  string *psVar1;
  stringstream ss;
  stringstream asStack_198 [16];
  ostream local_188 [112];
  ios_base local_118 [264];
  
  std::__cxx11::stringstream::stringstream(asStack_198);
  internal2::PrintBytesInObjectTo((uchar *)this,4,local_188);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_198);
  psVar1 = (string *)std::ios_base::~ios_base(local_118);
  return psVar1;
}

Assistant:

std::string FormatForComparisonFailureMessage(
    const T1& value, const T2& /* other_operand */) {
  return FormatForComparison<T1, T2>::Format(value);
}